

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddIte.c
# Opt level: O0

DdNode * cuddBddAndRecur(DdManager *manager,DdNode *f,DdNode *g)

{
  abctime aVar1;
  DdNode *pDVar2;
  DdNode *E;
  DdNode *pDVar3;
  DdNode *tmp;
  uint index;
  uint topg;
  uint topf;
  DdNode *e;
  DdNode *t;
  DdNode *r;
  DdNode *one;
  DdNode *gnv;
  DdNode *gv;
  DdNode *G;
  DdNode *fnv;
  DdNode *fv;
  DdNode *F;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *manager_local;
  
  pDVar2 = manager->one;
  fv = (DdNode *)((ulong)f & 0xfffffffffffffffe);
  gv = (DdNode *)((ulong)g & 0xfffffffffffffffe);
  manager_local = (DdManager *)f;
  if (fv == gv) {
    if (f != g) {
      manager_local = (DdManager *)((ulong)pDVar2 ^ 1);
    }
  }
  else if (fv == pDVar2) {
    if (f == pDVar2) {
      manager_local = (DdManager *)g;
    }
  }
  else if (gv == pDVar2) {
    manager_local = (DdManager *)g;
    if (g == pDVar2) {
      manager_local = (DdManager *)f;
    }
  }
  else {
    F = g;
    g_local = f;
    if ((*(long *)(((ulong)g & 0xfffffffffffffffe) + 0x20) << 1 | (long)(int)((uint)g & 1)) <
        (*(long *)(((ulong)f & 0xfffffffffffffffe) + 0x20) << 1 | (long)(int)((uint)f & 1))) {
      fv = (DdNode *)((ulong)g & 0xfffffffffffffffe);
      gv = (DdNode *)((ulong)f & 0xfffffffffffffffe);
      F = f;
      g_local = g;
    }
    if (((fv->ref == 1) && (gv->ref == 1)) ||
       (manager_local = (DdManager *)cuddCacheLookup2(manager,Cudd_bddAnd,g_local,F),
       manager_local == (DdManager *)0x0)) {
      if ((manager->TimeStop == 0) || (aVar1 = Abc_Clock(), aVar1 <= manager->TimeStop)) {
        if ((uint)manager->perm[gv->index] < (uint)manager->perm[fv->index]) {
          tmp._4_4_ = gv->index;
          G = g_local;
          fnv = g_local;
        }
        else {
          tmp._4_4_ = fv->index;
          fnv = (fv->type).kids.T;
          G = (fv->type).kids.E;
          if (((ulong)g_local & 1) != 0) {
            fnv = (DdNode *)((ulong)fnv ^ 1);
            G = (DdNode *)((ulong)G ^ 1);
          }
        }
        if ((uint)manager->perm[fv->index] < (uint)manager->perm[gv->index]) {
          one = F;
          gnv = F;
        }
        else {
          gnv = (gv->type).kids.T;
          one = (gv->type).kids.E;
          if (((ulong)F & 1) != 0) {
            gnv = (DdNode *)((ulong)gnv ^ 1);
            one = (DdNode *)((ulong)one ^ 1);
          }
        }
        pDVar2 = cuddBddAndRecur(manager,fnv,gnv);
        if (pDVar2 == (DdNode *)0x0) {
          manager_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
          E = cuddBddAndRecur(manager,G,one);
          if (E == (DdNode *)0x0) {
            Cudd_IterDerefBdd(manager,pDVar2);
            manager_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + 1;
            t = pDVar2;
            if (pDVar2 != E) {
              if (((ulong)pDVar2 & 1) == 0) {
                t = cuddUniqueInter(manager,tmp._4_4_,pDVar2,E);
                if (t == (DdNode *)0x0) {
                  Cudd_IterDerefBdd(manager,pDVar2);
                  Cudd_IterDerefBdd(manager,E);
                  return (DdNode *)0x0;
                }
              }
              else {
                pDVar3 = cuddUniqueInter(manager,tmp._4_4_,(DdNode *)((ulong)pDVar2 ^ 1),
                                         (DdNode *)((ulong)E ^ 1));
                if (pDVar3 == (DdNode *)0x0) {
                  Cudd_IterDerefBdd(manager,pDVar2);
                  Cudd_IterDerefBdd(manager,E);
                  return (DdNode *)0x0;
                }
                t = (DdNode *)((ulong)pDVar3 ^ 1);
              }
            }
            *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + -1;
            *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + -1;
            if ((fv->ref != 1) || (gv->ref != 1)) {
              cuddCacheInsert2(manager,Cudd_bddAnd,g_local,F,t);
            }
            manager_local = (DdManager *)t;
          }
        }
      }
      else {
        manager_local = (DdManager *)0x0;
      }
    }
  }
  return &manager_local->sentinel;
}

Assistant:

DdNode *
cuddBddAndRecur(
  DdManager * manager,
  DdNode * f,
  DdNode * g)
{
    DdNode *F, *fv, *fnv, *G, *gv, *gnv;
    DdNode *one, *r, *t, *e;
    unsigned int topf, topg, index;

    statLine(manager);
    one = DD_ONE(manager);

    /* Terminal cases. */
    F = Cudd_Regular(f);
    G = Cudd_Regular(g);
    if (F == G) {
        if (f == g) return(f);
        else return(Cudd_Not(one));
    }
    if (F == one) {
        if (f == one) return(g);
        else return(f);
    }
    if (G == one) {
        if (g == one) return(f);
        else return(g);
    }

    /* At this point f and g are not constant. */
    if (cuddF2L(f) > cuddF2L(g)) { /* Try to increase cache efficiency. */
        DdNode *tmp = f;
        f = g;
        g = tmp;
        F = Cudd_Regular(f);
        G = Cudd_Regular(g);
    }

    /* Check cache. */
    if (F->ref != 1 || G->ref != 1) {
        r = cuddCacheLookup2(manager, Cudd_bddAnd, f, g);
        if (r != NULL) return(r);
    }

    if ( manager->TimeStop && Abc_Clock() > manager->TimeStop )
        return NULL;

    /* Here we can skip the use of cuddI, because the operands are known
    ** to be non-constant.
    */
    topf = manager->perm[F->index];
    topg = manager->perm[G->index];

    /* Compute cofactors. */
    if (topf <= topg) {
        index = F->index;
        fv = cuddT(F);
        fnv = cuddE(F);
        if (Cudd_IsComplement(f)) {
            fv = Cudd_Not(fv);
            fnv = Cudd_Not(fnv);
        }
    } else {
        index = G->index;
        fv = fnv = f;
    }

    if (topg <= topf) {
        gv = cuddT(G);
        gnv = cuddE(G);
        if (Cudd_IsComplement(g)) {
            gv = Cudd_Not(gv);
            gnv = Cudd_Not(gnv);
        }
    } else {
        gv = gnv = g;
    }

    t = cuddBddAndRecur(manager, fv, gv);
    if (t == NULL) return(NULL);
    cuddRef(t);

    e = cuddBddAndRecur(manager, fnv, gnv);
    if (e == NULL) {
        Cudd_IterDerefBdd(manager, t);
        return(NULL);
    }
    cuddRef(e);

    if (t == e) {
        r = t;
    } else {
        if (Cudd_IsComplement(t)) {
            r = cuddUniqueInter(manager,(int)index,Cudd_Not(t),Cudd_Not(e));
            if (r == NULL) {
                Cudd_IterDerefBdd(manager, t);
                Cudd_IterDerefBdd(manager, e);
                return(NULL);
            }
            r = Cudd_Not(r);
        } else {
            r = cuddUniqueInter(manager,(int)index,t,e);
            if (r == NULL) {
                Cudd_IterDerefBdd(manager, t);
                Cudd_IterDerefBdd(manager, e);
                return(NULL);
            }
        }
    }
    cuddDeref(e);
    cuddDeref(t);
    if (F->ref != 1 || G->ref != 1)
        cuddCacheInsert2(manager, Cudd_bddAnd, f, g, r);
    return(r);

}